

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O0

void llmsset_free(llmsset_t dbs)

{
  llmsset_t dbs_local;
  
  free_aligned(dbs->table,dbs->max_size << 3);
  free_aligned(dbs->data,dbs->max_size << 4);
  free_aligned(dbs->bitmap1,dbs->max_size >> 0xc);
  free_aligned(dbs->bitmap2,dbs->max_size >> 3);
  free_aligned(dbs->bitmapc,dbs->max_size >> 3);
  free_aligned(dbs,0x70);
  return;
}

Assistant:

void
llmsset_free(llmsset_t dbs)
{
    free_aligned(dbs->table, dbs->max_size * 8);
    free_aligned(dbs->data, dbs->max_size * 16);
    free_aligned(dbs->bitmap1, dbs->max_size / (512*8));
    free_aligned(dbs->bitmap2, dbs->max_size / 8);
    free_aligned(dbs->bitmapc, dbs->max_size / 8);
    free_aligned(dbs, sizeof(struct llmsset));
}